

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::HoursOperator>>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  Vector VVar1;
  undefined8 *puVar2;
  int32_t *piVar3;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  date_t *pdVar5;
  optional_idx oVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  bool bVar8;
  VectorBuffer *pVVar9;
  idx_t iVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  _Head_base<0UL,_unsigned_long_*,_false> _Var12;
  SelectionVector *pSVar13;
  VectorType VVar14;
  optional_idx dict_size;
  optional_idx local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_80;
  ValidityMask local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  unsigned_long local_38;
  
  VVar1 = *input;
  VVar14 = (VectorType)result;
  if (VVar1 == (Vector)0x0) {
    duckdb::Vector::SetVectorType(VVar14);
    plVar4 = *(long **)(result + 0x20);
    pdVar5 = *(date_t **)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    FlatVector::VerifyFlatVector(result);
    ExecuteFlat<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::HoursOperator>>
              (pdVar5,plVar4,count,(ValidityMask *)(input + 0x28),(ValidityMask *)(result + 0x28),
               dataptr,adds_nulls);
  }
  else {
    if (VVar1 == (Vector)0x3) {
      if (errors == CANNOT_ERROR) {
        DictionaryVector::VerifyDictionary(input);
        pVVar9 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                           ((shared_ptr<duckdb::VectorBuffer,_true> *)(input + 0x48));
        local_88.index = *(idx_t *)(pVVar9 + 0x48);
        if (((SelectionVector *)local_88.index != (SelectionVector *)0xffffffffffffffff) &&
           (iVar10 = optional_idx::GetIndex(&local_88), iVar10 * 2 <= count)) {
          DictionaryVector::VerifyDictionary(input);
          pVVar9 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                             ((shared_ptr<duckdb::VectorBuffer,_true> *)(input + 0x58));
          if (pVVar9[0x30] == (VectorBuffer)0x0) {
            plVar4 = *(long **)(result + 0x20);
            pdVar5 = *(date_t **)(pVVar9 + 0x50);
            iVar10 = optional_idx::GetIndex(&local_88);
            FlatVector::VerifyFlatVector((Vector *)(pVVar9 + 0x30));
            FlatVector::VerifyFlatVector(result);
            ExecuteFlat<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::HoursOperator>>
                      (pdVar5,plVar4,iVar10,(ValidityMask *)(pVVar9 + 0x58),
                       (ValidityMask *)(result + 0x28),dataptr,adds_nulls);
            DictionaryVector::VerifyDictionary(input);
            pVVar9 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                               ((shared_ptr<duckdb::VectorBuffer,_true> *)(input + 0x48));
            pSVar13 = (SelectionVector *)optional_idx::GetIndex(&local_88);
            duckdb::Vector::Dictionary(result,(ulong)result,pSVar13,(ulong)(pVVar9 + 0x30));
            return;
          }
        }
      }
    }
    else if (VVar1 == (Vector)0x2) {
      duckdb::Vector::SetVectorType(VVar14);
      puVar2 = *(undefined8 **)(result + 0x20);
      piVar3 = *(int32_t **)(input + 0x20);
      if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
        duckdb::ConstantVector::SetNull(result,true);
        return;
      }
      duckdb::ConstantVector::SetNull(result,false);
      bVar8 = duckdb::Value::IsFinite<duckdb::date_t>((date_t)*piVar3);
      if (!bVar8) {
        _Var12._M_head_impl = *(unsigned_long **)(result + 0x28);
        if (_Var12._M_head_impl == (unsigned_long *)0x0) {
          local_38 = *(unsigned_long *)(result + 0x40);
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_88,&local_38);
          p_Var7 = p_Stack_80;
          oVar6.index = local_88.index;
          local_88.index = 0;
          p_Stack_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38);
          *(idx_t *)(result + 0x30) = oVar6.index;
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(result + 0x38) = p_Var7;
          if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
             p_Stack_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_80);
          }
          pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (result + 0x30));
          _Var12._M_head_impl =
               (pTVar11->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(unsigned_long **)(result + 0x28) = _Var12._M_head_impl;
        }
        *(byte *)_Var12._M_head_impl = (byte)*_Var12._M_head_impl & 0xfe;
      }
      *puVar2 = 0;
      return;
    }
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_88);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    duckdb::Vector::SetVectorType(VVar14);
    oVar6.index = local_88.index;
    plVar4 = *(long **)(result + 0x20);
    FlatVector::VerifyFlatVector(result);
    ExecuteLoop<duckdb::date_t,long,duckdb::GenericUnaryWrapper,duckdb::DatePart::PartOperator<duckdb::DatePart::HoursOperator>>
              ((date_t *)p_Stack_80,plVar4,count,(SelectionVector *)oVar6.index,&local_78,
               (ValidityMask *)(result + 0x28),dataptr,adds_nulls);
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
    if (local_78.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}